

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  char *buffer;
  Nonnull<char_*> pcVar1;
  AlphaNum *in_R8;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined8 local_48;
  char *local_40;
  
  local_48 = 0x17;
  local_40 = "Extension declaration #";
  buffer = local_a8.digits_;
  pcVar1 = numbers_internal::FastIntToBuffer(*(int32_t *)(*(long *)this + 0x28),buffer);
  local_a8.piece_._M_len = (long)pcVar1 - (long)buffer;
  local_78.piece_._M_len = 0x2d;
  local_78.piece_._M_str = " should have both \"full_name\" and \"type\" set.";
  local_a8.piece_._M_str = buffer;
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_48,&local_a8,&local_78,in_R8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}